

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O2

void ProcessEDSectors(void)

{
  size_t __n;
  int recordnum;
  sector_t *psVar1;
  hash_t hVar2;
  int iVar3;
  void *__s;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  InitED();
  hVar2 = TMap<int,_EDSector,_THashTraits<int>,_TValueTraits<EDSector>_>::CountUsed(&EDSectors);
  if (hVar2 != 0) {
    __n = (long)numsectors * 4;
    uVar5 = 0xffffffffffffffff;
    if (-1 < (long)numsectors) {
      uVar5 = __n;
    }
    __s = operator_new__(uVar5);
    memset(__s,0xff,__n);
    psVar1 = sectors;
    piVar4 = &lines->special;
    iVar3 = numlines;
    for (lVar6 = 0; lVar6 < iVar3; lVar6 = lVar6 + 1) {
      if ((*piVar4 == 0xbe) && (piVar4[2] == 0xfd)) {
        *(int *)((long)__s + ((long)*(sector_t **)(piVar4 + 0x14) - (long)psVar1) / 0x9a) =
             piVar4[1];
        *piVar4 = 0;
        iVar3 = numlines;
      }
      piVar4 = piVar4 + 0x26;
    }
    lVar6 = 0;
    iVar3 = numsectors;
    for (lVar7 = 0; lVar7 < iVar3; lVar7 = lVar7 + 1) {
      recordnum = *(int *)((long)__s + lVar7 * 4);
      if (-1 < recordnum) {
        ProcessEDSector((sector_t *)((long)&sectors->planes[0].xform.xOffs + lVar6),recordnum);
        iVar3 = numsectors;
      }
      lVar6 = lVar6 + 0x268;
    }
    operator_delete__(__s);
    return;
  }
  return;
}

Assistant:

void ProcessEDSectors()
{
	int i;

	InitED();
	if (EDSectors.CountUsed() == 0) return;	// don't waste time if there's no records.

	// collect all Extradata sector records up front so we do not need to search the complete line array for each sector separately.
	int *sectorrecord = new int[numsectors];
	memset(sectorrecord, -1, numsectors * sizeof(int));
	for (i = 0; i < numlines; i++)
	{
		if (lines[i].special == Static_Init && lines[i].args[1] == Init_EDSector)
		{
			sectorrecord[lines[i].frontsector - sectors] = lines[i].args[0];
			lines[i].special = 0;
		}
	}
	for (i = 0; i < numsectors; i++)
	{
		if (sectorrecord[i] >= 0)
		{
			ProcessEDSector(&sectors[i], sectorrecord[i]);
		}
	}
	delete[] sectorrecord;
}